

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger default_delegate_tofloat(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQRESULT SVar3;
  SQFloat x;
  SQObjectPtr res;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffff38;
  HSQUIRRELVM in_stack_ffffffffffffff40;
  SQVM *this;
  SQFloat local_ac;
  SQInteger in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  SQChar *in_stack_ffffffffffffff68;
  SQFloat local_8c;
  undefined1 local_70 [36];
  int local_4c;
  SQObjectPtr local_48 [2];
  SQObjectPtr local_28;
  SQOuter *local_18;
  
  local_18 = (SQOuter *)stack_get(in_stack_ffffffffffffff40,(SQInteger)in_stack_ffffffffffffff38);
  SVar1 = *(SQObjectType *)&(local_18->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
  if (SVar1 == OT_BOOL) {
    local_ac = 1.0;
    if (((SQObjectValue *)&(local_18->super_SQCollectable).super_SQRefCounted._uiRef)->pTable ==
        (SQTable *)0x0) {
      local_ac = 0.0;
    }
    this = (SQVM *)local_70;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,local_ac);
    SQVM::Push(this,in_stack_ffffffffffffff38);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  }
  else if ((SVar1 == OT_INTEGER) || (SVar1 == OT_FLOAT)) {
    if (*(SQObjectType *)&(local_18->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted ==
        OT_INTEGER) {
      x = (SQFloat)((SQObjectValue *)&(local_18->super_SQCollectable).super_SQRefCounted._uiRef)->
                   nInteger;
    }
    else {
      x = ((SQObjectValue *)&(local_18->super_SQCollectable).super_SQRefCounted._uiRef)->fFloat;
    }
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_70 + 0x10),x);
    SQVM::Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
  }
  else if (SVar1 == OT_STRING) {
    SQObjectPtr::SQObjectPtr(&local_28);
    bVar2 = str2num(in_stack_ffffffffffffff68,
                    (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
    if (bVar2) {
      if (local_28.super_SQObject._type == OT_INTEGER) {
        local_8c = (SQFloat)CONCAT44(local_28.super_SQObject._unVal.nInteger._4_4_,
                                     local_28.super_SQObject._unVal.fFloat);
      }
      else {
        local_8c = local_28.super_SQObject._unVal.fFloat;
      }
      SQObjectPtr::SQObjectPtr(local_48,local_8c);
      SQVM::Push(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
      local_4c = 2;
    }
    else {
      local_4c = 0;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff40);
    if (local_4c == 0) {
      SVar3 = sq_throwerror(in_stack_ffffffffffffff40,(SQChar *)in_stack_ffffffffffffff38);
      return SVar3;
    }
  }
  else {
    SQVM::PushNull((SQVM *)0x13d5f4);
  }
  return 1;
}

Assistant:

static SQInteger default_delegate_tofloat(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,10)){
            v->Push(SQObjectPtr(tofloat(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tofloat(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr((SQFloat)(_integer(o)?1:0)));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}